

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::FindOrPreloadCluster(Segment *this,longlong requested_pos)

{
  undefined1 auVar1 [16];
  bool bVar2;
  longlong lVar3;
  Cluster *pCVar4;
  Segment *in_RSI;
  long in_RDI;
  ptrdiff_t idx;
  Cluster *pCluster;
  longlong pos;
  Cluster *pCluster_1;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  long count;
  Cluster **i;
  Cluster **ii;
  Cluster *in_stack_ffffffffffffffb0;
  Segment *in_stack_ffffffffffffffb8;
  Segment *idx_00;
  Segment *pSegment;
  Segment *idx_01;
  Segment *pCluster_00;
  Cluster *local_8;
  
  if ((long)in_RSI < 0) {
    local_8 = (Cluster *)0x0;
  }
  else {
    idx_01 = *(Segment **)(in_RDI + 0xa8);
    pSegment = (Segment *)(&idx_01->m_pReader + *(long *)(in_RDI + 0xb0) + *(long *)(in_RDI + 0xb8))
    ;
    idx_00 = pSegment;
    pCluster_00 = idx_01;
    do {
      while( true ) {
        if (idx_00 <= idx_01) {
          pCVar4 = Cluster::Create(pSegment,(long)idx_00,(longlong)in_stack_ffffffffffffffb8);
          if (pCVar4 == (Cluster *)0x0) {
            return (Cluster *)0x0;
          }
          bVar2 = PreloadCluster(in_RSI,(Cluster *)pCluster_00,(ptrdiff_t)idx_01);
          if (bVar2) {
            return pCVar4;
          }
          if (pCVar4 != (Cluster *)0x0) {
            Cluster::~Cluster(in_stack_ffffffffffffffb0);
            operator_delete(pCVar4);
          }
          return (Cluster *)0x0;
        }
        auVar1._8_8_ = (long)idx_00 - (long)idx_01 >> 0x3f;
        auVar1._0_8_ = (long)idx_00 - (long)idx_01 >> 3;
        in_stack_ffffffffffffffb8 = (Segment *)(&idx_01->m_pReader + SUB168(auVar1 / SEXT816(2),0));
        in_stack_ffffffffffffffb0 = (Cluster *)in_stack_ffffffffffffffb8->m_pReader;
        lVar3 = Cluster::GetPosition(in_stack_ffffffffffffffb0);
        if ((long)in_RSI <= lVar3) break;
        idx_01 = (Segment *)&in_stack_ffffffffffffffb8->m_element_start;
      }
      idx_00 = in_stack_ffffffffffffffb8;
      local_8 = in_stack_ffffffffffffffb0;
    } while ((long)in_RSI < lVar3);
  }
  return local_8;
}

Assistant:

const Cluster* Segment::FindOrPreloadCluster(long long requested_pos) {
  if (requested_pos < 0)
    return 0;

  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < requested_pos)
      i = k + 1;
    else if (pos > requested_pos)
      j = k;
    else
      return pCluster;
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, requested_pos);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster;
}